

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QThreadPrivate::~QThreadPrivate(QThreadPrivate *this)

{
  ulong uVar1;
  _Vector_base<QObject_*,_std::allocator<QObject_*>_> *this_00;
  
  (this->super_QObjectPrivate).super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QThreadPrivate_00666ea0;
  uVar1 = (this->m_statusOrPendingObjects).data.super___atomic_base<unsigned_long_long>._M_i;
  this_00 = (_Vector_base<QObject_*,_std::allocator<QObject_*>_> *)
            (-(ulong)((uint)uVar1 & 1) & uVar1 & 0xfffffffffffffffe);
  if (this_00 != (_Vector_base<QObject_*,_std::allocator<QObject_*>_> *)0x0) {
    std::_Vector_base<QObject_*,_std::allocator<QObject_*>_>::~_Vector_base(this_00);
  }
  operator_delete(this_00,0x18);
  QThreadData::clearEvents(this->data);
  QThreadData::deref(this->data);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->objectName).d);
  QWaitCondition::~QWaitCondition(&this->thread_done);
  QMutex::~QMutex(&this->mutex);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QThreadPrivate::~QThreadPrivate()
{
    // access to m_statusOrPendingObjects cannot race with anything
    // unless there is already a potential use-after-free bug, as the
    // thread is in the process of being destroyed
    delete m_statusOrPendingObjects.list();
    data->clearEvents();
    data->deref();
}